

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *ctx,int start,char chr,int end)

{
  jsparser_ctx *js;
  char cVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  uint pos;
  char buffer [18];
  
  if (ctx == (statemachine_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c3,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  js = (jsparser_ctx *)ctx->user;
  if (js == (jsparser_ctx *)0x0) {
    __assert_fail("ctx->user != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c4,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  cVar1 = jsparser_buffer_get(js,-1);
  iVar3 = js_is_whitespace(cVar1);
  pos = iVar3 == 0 | 0xfffffffe;
  bVar2 = jsparser_buffer_get(js,pos);
  uVar4 = (ulong)bVar2;
  if (bVar2 < 0x40) {
    if ((0xfc00956200000001U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x2b) {
        cVar1 = jsparser_buffer_get(js,pos - 1);
        if (cVar1 == '+') goto LAB_0013427a;
      }
      else {
        if (uVar4 != 0x2d) goto LAB_0013425a;
        cVar1 = jsparser_buffer_get(js,pos - 1);
        if (cVar1 == '-') goto LAB_0013427a;
      }
    }
  }
  else {
LAB_0013425a:
    if (((0x23 < bVar2 - 0x5b) || ((0xf00000009U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) == 0)) &&
       ((iVar3 = jsparser_buffer_last_identifier(js,buffer), iVar3 == 0 ||
        (pvVar5 = bsearch(buffer,regexp_token_prefix,0x2f,8,bsearch_strcmp), pvVar5 == (void *)0x0))
       )) goto LAB_0013427a;
  }
  ctx->next_state = 6;
LAB_0013427a:
  jsparser_buffer_append_chr(js,chr);
  return;
}

Assistant:

static void enter_state_js_slash(statemachine_ctx *ctx, int start, char chr,
                                 int end)
{
  jsparser_ctx *js;
  char buffer[JSPARSER_RING_BUFFER_SIZE];
  int pos;

  assert(ctx != NULL);
  assert(ctx->user != NULL);

  js = CAST(jsparser_ctx *, ctx->user);
  assert(js != NULL);

  pos = -1;
  /* Consume the last whitespace. */
  if (js_is_whitespace(jsparser_buffer_get(js, pos))) {
    --pos;
  }

  switch (jsparser_buffer_get(js, pos)) {
    /* Ignore unary increment */
    case '+':
      if (jsparser_buffer_get(js, pos - 1) != '+') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* Ignore unary decrement */
    case '-':
      if (jsparser_buffer_get(js, pos - 1) != '-') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* List of punctuator endings except ), ], }, + and - */
    case '=':
    case '<':
    case '>':
    case '&':
    case '|':
    case '!':
    case '%':
    case '*':
    case '/':
    case ',':
    case ';':
    case '?':
    case ':':
    case '^':
    case '~':
    case '{':
    case '(':
    case '[':
    case '}':
    case '\0':
      ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      break;

    default:
      if (jsparser_buffer_last_identifier(js, buffer) &&
          is_regexp_token_prefix(buffer)) {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
  }

  jsparser_buffer_append_chr(js, chr);
}